

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::ShowMetricsWindow::Funcs::NodeDrawList(ImDrawList *draw_list,char *label)

{
  ulong uVar1;
  ImGuiWindow *pIVar2;
  ImVec2 IVar3;
  ImGuiContext *pIVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  value_type *pvVar8;
  char *pcVar9;
  ImDrawCmd *pIVar10;
  char *pcVar11;
  unsigned_short *puVar12;
  ulong uVar13;
  uint uVar14;
  ImDrawList *this;
  ImDrawCmd *pIVar15;
  long lVar16;
  int local_1d4;
  ImGuiListClipper clipper;
  ImVec2 local_190;
  ImVec2 triangles_pos [3];
  char buf [300];
  
  pcVar9 = "";
  if (draw_list->_OwnerName != (char *)0x0) {
    pcVar9 = draw_list->_OwnerName;
  }
  bVar5 = TreeNode(draw_list,"%s: \'%s\' %d vtx, %d indices, %d cmds","DrawList",pcVar9,
                   (ulong)(uint)(draw_list->VtxBuffer).Size,(ulong)(uint)(draw_list->IdxBuffer).Size
                   ,(draw_list->CmdBuffer).Size);
  pIVar4 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->Accessed = true;
  if (pIVar2->DrawList == draw_list) {
    SameLine(0.0,-1.0);
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = -0x80;
    buf[3] = '?';
    buf[4] = -0x36;
    buf[5] = -0x38;
    buf[6] = -0x38;
    buf[7] = '>';
    buf[8] = -0x36;
    buf[9] = -0x38;
    buf[10] = -0x38;
    buf[0xb] = '>';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = -0x80;
    buf[0xf] = '?';
    TextColored((ImVec4 *)buf,"CURRENTLY APPENDING");
    if (bVar5) {
      TreePop();
      return;
    }
  }
  else if (bVar5) {
    this = &pIVar4->OverlayDrawList;
    ImDrawList::PushClipRectFullScreen(this);
    pIVar10 = (draw_list->CmdBuffer).Data;
    local_1d4 = 0;
    for (pIVar15 = pIVar10; pIVar15 < pIVar10 + (draw_list->CmdBuffer).Size; pIVar15 = pIVar15 + 1)
    {
      if (pIVar15->UserCallback == (ImDrawCallback)0x0) {
        if ((draw_list->IdxBuffer).Size < 1) {
          pcVar9 = "non-indexed";
          puVar12 = (unsigned_short *)0x0;
        }
        else {
          puVar12 = (draw_list->IdxBuffer).Data;
          pcVar9 = "indexed";
        }
        bVar5 = TreeNode((void *)(((long)pIVar15 - (long)pIVar10) / 0x30),
                         "Draw %-4d %s vtx, tex = %p, clip_rect = (%.0f,%.0f)..(%.0f,%.0f)",
                         (double)(pIVar15->ClipRect).x,(double)(pIVar15->ClipRect).y,
                         (double)(pIVar15->ClipRect).z,(double)(pIVar15->ClipRect).w,
                         (ulong)pIVar15->ElemCount,pcVar9,pIVar15->TextureId);
        if ((show_clip_rects == true) &&
           ((GImGui->CurrentWindow->DC).LastItemHoveredAndUsable == true)) {
          buf._0_8_ = *(undefined8 *)&pIVar15->ClipRect;
          buf._8_8_ = *(undefined8 *)&(pIVar15->ClipRect).z;
          clipper.StartPosY = 3.4028235e+38;
          clipper.ItemsHeight = 3.4028235e+38;
          clipper.ItemsCount = -0x800001;
          clipper.StepNo = -0x800001;
          for (lVar16 = (long)local_1d4; lVar16 < (long)(int)pIVar15->ElemCount + (long)local_1d4;
              lVar16 = lVar16 + 1) {
            if (puVar12 == (unsigned_short *)0x0) {
              uVar14 = (uint)lVar16;
            }
            else {
              uVar14 = (uint)puVar12[lVar16];
            }
            pvVar8 = ImVector<ImDrawVert>::operator[](&draw_list->VtxBuffer,uVar14);
            ImRect::Add((ImRect *)&clipper,&pvVar8->pos);
          }
          ImRect::Floor((ImRect *)buf);
          ImDrawList::AddRect(this,(ImVec2 *)buf,(ImVec2 *)(buf + 8),0xff00ffff,0.0,0xf,1.0);
          ImRect::Floor((ImRect *)&clipper);
          ImDrawList::AddRect(this,(ImVec2 *)&clipper,(ImVec2 *)&clipper.ItemsCount,0xffff00ff,0.0,
                              0xf,1.0);
        }
        if (bVar5) {
          uVar14 = pIVar15->ElemCount;
          clipper.StartPosY = GetCursorPosY();
          clipper.ItemsHeight = -1.0;
          clipper.StepNo = 0;
          clipper.DisplayStart = -1;
          clipper.DisplayEnd = -1;
          clipper.ItemsCount = uVar14 / 3;
          while (bVar5 = ImGuiListClipper::Step(&clipper), bVar5) {
            uVar13 = (ulong)(uint)(clipper.DisplayStart * 3 + local_1d4);
            for (iVar7 = clipper.DisplayStart; iVar7 < clipper.DisplayEnd; iVar7 = iVar7 + 1) {
              triangles_pos[0].x = 0.0;
              triangles_pos[0].y = 0.0;
              triangles_pos[1].x = 0.0;
              triangles_pos[1].y = 0.0;
              triangles_pos[2].x = 0.0;
              triangles_pos[2].y = 0.0;
              pcVar9 = buf;
              for (lVar16 = 0; lVar16 != 3; lVar16 = lVar16 + 1) {
                uVar1 = lVar16 + (uVar13 & 0xffffffff);
                if (puVar12 == (unsigned_short *)0x0) {
                  uVar14 = (uint)uVar1;
                }
                else {
                  uVar14 = (uint)puVar12[(int)uVar13 + lVar16];
                }
                pvVar8 = ImVector<ImDrawVert>::operator[](&draw_list->VtxBuffer,uVar14);
                IVar3 = pvVar8->pos;
                triangles_pos[lVar16] = IVar3;
                pcVar11 = "   ";
                if (lVar16 == 0) {
                  pcVar11 = "vtx";
                }
                iVar6 = sprintf(pcVar9,
                                "%s %04d { pos = (%8.2f,%8.2f), uv = (%.6f,%.6f), col = %08X }\n",
                                (double)IVar3.x,(double)IVar3.y,(double)(pvVar8->uv).x,
                                (double)(pvVar8->uv).y,pcVar11,uVar1 & 0xffffffff,(ulong)pvVar8->col
                               );
                pcVar9 = pcVar9 + iVar6;
              }
              local_190.x = 0.0;
              local_190.y = 0.0;
              Selectable(buf,false,0,&local_190);
              if ((GImGui->CurrentWindow->DC).LastItemHoveredAndUsable == true) {
                ImDrawList::AddPolyline(this,triangles_pos,3,0xff00ffff,true,1.0,false);
              }
              uVar13 = (uVar13 & 0xffffffff) + 3;
            }
          }
          TreePop();
          ImGuiListClipper::~ImGuiListClipper(&clipper);
        }
      }
      else {
        BulletText("Callback %p, user_data %p",pIVar15->UserCallback,pIVar15->UserCallbackData);
      }
      local_1d4 = local_1d4 + pIVar15->ElemCount;
      pIVar10 = (draw_list->CmdBuffer).Data;
    }
    ImDrawList::PopClipRect(this);
    TreePop();
  }
  return;
}

Assistant:

static void NodeDrawList(ImDrawList* draw_list, const char* label)
            {
                bool node_open = ImGui::TreeNode(draw_list, "%s: '%s' %d vtx, %d indices, %d cmds", label, draw_list->_OwnerName ? draw_list->_OwnerName : "", draw_list->VtxBuffer.Size, draw_list->IdxBuffer.Size, draw_list->CmdBuffer.Size);
                if (draw_list == ImGui::GetWindowDrawList())
                {
                    ImGui::SameLine();
                    ImGui::TextColored(ImColor(255,100,100), "CURRENTLY APPENDING"); // Can't display stats for active draw list! (we don't have the data double-buffered)
                    if (node_open) ImGui::TreePop();
                    return;
                }
                if (!node_open)
                    return;

                ImDrawList* overlay_draw_list = &GImGui->OverlayDrawList;   // Render additional visuals into the top-most draw list
                overlay_draw_list->PushClipRectFullScreen();
                int elem_offset = 0;
                for (const ImDrawCmd* pcmd = draw_list->CmdBuffer.begin(); pcmd < draw_list->CmdBuffer.end(); elem_offset += pcmd->ElemCount, pcmd++)
                {
                    if (pcmd->UserCallback)
                    {
                        ImGui::BulletText("Callback %p, user_data %p", pcmd->UserCallback, pcmd->UserCallbackData);
                        continue;
                    }
                    ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;
                    bool pcmd_node_open = ImGui::TreeNode((void*)(pcmd - draw_list->CmdBuffer.begin()), "Draw %-4d %s vtx, tex = %p, clip_rect = (%.0f,%.0f)..(%.0f,%.0f)", pcmd->ElemCount, draw_list->IdxBuffer.Size > 0 ? "indexed" : "non-indexed", pcmd->TextureId, pcmd->ClipRect.x, pcmd->ClipRect.y, pcmd->ClipRect.z, pcmd->ClipRect.w);
                    if (show_clip_rects && ImGui::IsItemHovered())
                    {
                        ImRect clip_rect = pcmd->ClipRect;
                        ImRect vtxs_rect;
                        for (int i = elem_offset; i < elem_offset + (int)pcmd->ElemCount; i++)
                            vtxs_rect.Add(draw_list->VtxBuffer[idx_buffer ? idx_buffer[i] : i].pos);
                        clip_rect.Floor(); overlay_draw_list->AddRect(clip_rect.Min, clip_rect.Max, IM_COL32(255,255,0,255));
                        vtxs_rect.Floor(); overlay_draw_list->AddRect(vtxs_rect.Min, vtxs_rect.Max, IM_COL32(255,0,255,255));
                    }
                    if (!pcmd_node_open)
                        continue;
                    ImGuiListClipper clipper(pcmd->ElemCount/3); // Manually coarse clip our print out of individual vertices to save CPU, only items that may be visible.
                    while (clipper.Step())
                        for (int prim = clipper.DisplayStart, vtx_i = elem_offset + clipper.DisplayStart*3; prim < clipper.DisplayEnd; prim++)
                        {
                            char buf[300], *buf_p = buf;
                            ImVec2 triangles_pos[3];
                            for (int n = 0; n < 3; n++, vtx_i++)
                            {
                                ImDrawVert& v = draw_list->VtxBuffer[idx_buffer ? idx_buffer[vtx_i] : vtx_i];
                                triangles_pos[n] = v.pos;
                                buf_p += sprintf(buf_p, "%s %04d { pos = (%8.2f,%8.2f), uv = (%.6f,%.6f), col = %08X }\n", (n == 0) ? "vtx" : "   ", vtx_i, v.pos.x, v.pos.y, v.uv.x, v.uv.y, v.col);
                            }
                            ImGui::Selectable(buf, false);
                            if (ImGui::IsItemHovered())
                                overlay_draw_list->AddPolyline(triangles_pos, 3, IM_COL32(255,255,0,255), true, 1.0f, false);  // Add triangle without AA, more readable for large-thin triangle
                        }
                    ImGui::TreePop();
                }
                overlay_draw_list->PopClipRect();
                ImGui::TreePop();
            }